

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_state.cc
# Opt level: O1

void pgraph_dump_control(int cnum,pgraph_state *state)

{
  Register *pRVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  pointer puVar5;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  local_40;
  
  hwtest::pgraph::pgraph_control_regs(&local_40,&state->chipset);
  for (puVar5 = local_40.
                super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar5 != local_40.
                super__Vector_base<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
    pRVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
             ._M_t.
             super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
             .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
    iVar3 = (*pRVar1->_vptr_Register[6])(pRVar1,cnum);
    pRVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
             ._M_t.
             super__Tuple_impl<0UL,_hwtest::pgraph::Register_*,_std::default_delete<hwtest::pgraph::Register>_>
             .super__Head_base<0UL,_hwtest::pgraph::Register_*,_false>._M_head_impl;
    iVar4 = (*pRVar1->_vptr_Register[3])(pRVar1,state);
    *(int *)CONCAT44(extraout_var,iVar4) = iVar3;
  }
  std::
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  ::~vector(&local_40);
  iVar3 = (state->chipset).card_type;
  pvVar2 = nva_cards[cnum]->bar0;
  if (iVar3 < 4) {
    state->intr = *(uint *)((long)pvVar2 + 0x400100) & 0xfffffeff;
    state->invalid = *(uint32_t *)((long)pvVar2 + 0x400104);
  }
  else {
    state->intr = *(uint *)((long)pvVar2 + 0x400100);
    state->nsource = *(uint32_t *)((long)pvVar2 + 0x400108);
    if (iVar3 - 0x10U < 0x30) {
      state->state3d = *(uint32_t *)((long)pvVar2 + 0x40077c);
    }
    if (((iVar3 < 0x20) && (iVar3 = (state->chipset).chipset, 0x16 < iVar3)) && (iVar3 != 0x1a)) {
      state->zcull_unka00[0] = *(uint32_t *)((long)pvVar2 + 0x400a00);
      state->zcull_unka00[1] = *(uint32_t *)((long)pvVar2 + 0x400a04);
      state->unka10 = *(uint32_t *)((long)pvVar2 + 0x400a10);
    }
  }
  return;
}

Assistant:

void pgraph_dump_control(int cnum, struct pgraph_state *state) {
	for (auto &reg : pgraph_control_regs(state->chipset)) {
		reg->ref(state) = reg->read(cnum);
	}
	if (state->chipset.card_type < 4) {
		state->intr = nva_rd32(cnum, 0x400100) & ~0x100;
		state->invalid = nva_rd32(cnum, 0x400104);
	} else {
		state->intr = nva_rd32(cnum, 0x400100);
		state->nsource = nva_rd32(cnum, 0x400108);
		if (state->chipset.card_type >= 0x10 && state->chipset.card_type < 0x40)
			state->state3d = nva_rd32(cnum, 0x40077c);
		bool is_nv17p = nv04_pgraph_is_nv17p(&state->chipset);
		if (is_nv17p) {
			state->zcull_unka00[0] = nva_rd32(cnum, 0x400a00);
			state->zcull_unka00[1] = nva_rd32(cnum, 0x400a04);
			state->unka10 = nva_rd32(cnum, 0x400a10);
		}
	}
}